

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<9,_2,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float fVar1;
  float fVar2;
  int i;
  float *pfVar3;
  long lVar4;
  int row;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Mat3 m;
  Vector<float,_3> res;
  Mat3 m_1;
  float local_d0 [4];
  float local_c0 [4];
  float local_b0 [4];
  float local_a0 [2];
  undefined8 local_98;
  undefined4 local_90;
  float local_84;
  undefined8 local_80;
  float local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  Matrix<float,_3,_3> local_60;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  long lVar8;
  
  pfVar3 = &local_84;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar7 = _DAT_019fcc00;
    do {
      bVar9 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
              SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6) = uVar11;
      }
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 + -0xc != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6 + 0xc) = uVar11;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 3);
  local_80 = *(undefined8 *)(evalCtx->in[0].m_data + 1);
  fVar1 = evalCtx->in[0].m_data[0];
  fVar2 = evalCtx->in[0].m_data[1];
  local_84 = evalCtx->in[0].m_data[0];
  local_78 = evalCtx->in[1].m_data[0];
  local_74 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  uStack_6c = *(undefined8 *)evalCtx->in[2].m_data;
  local_64 = evalCtx->in[2].m_data[2];
  local_60.m_data.m_data[0].m_data[2] = 0.0;
  local_60.m_data.m_data[0].m_data[0] = 0.0;
  local_60.m_data.m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    local_60.m_data.m_data[0].m_data[lVar4] = (&local_84)[lVar4] + (&local_78)[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c0[2] = 0.0;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar4 = 0;
  do {
    local_c0[lVar4] =
         local_60.m_data.m_data[0].m_data[lVar4] + *(float *)((long)&uStack_6c + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pfVar3 = &local_38;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar10 = _DAT_019fcc00;
    do {
      bVar9 = SUB164(auVar10 ^ _DAT_019f5ce0,4) == -0x80000000 &&
              SUB164(auVar10 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6) = uVar11;
      }
      if (bVar9) {
        uVar11 = 0x3f800000;
        if (lVar4 + -0xc != lVar6) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar6 + 0xc) = uVar11;
      }
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0xc;
    pfVar3 = pfVar3 + 1;
  } while (lVar5 != 3);
  uStack_30 = (undefined4)((ulong)local_80 >> 0x20);
  local_38 = fVar1;
  fStack_34 = fVar2;
  fStack_2c = local_78;
  local_28 = local_74;
  uStack_20 = uStack_6c;
  local_18 = local_64;
  increment<float,3,3>(&local_60,(MatrixCaseUtils *)&local_38,(Matrix<float,_3,_3> *)0x3);
  local_98 = (ulong)local_98._4_4_ << 0x20;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar4 = 0;
  do {
    local_a0[lVar4] =
         local_60.m_data.m_data[0].m_data[lVar4] + local_60.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d0[2] = 0.0;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  lVar4 = 0;
  do {
    local_d0[lVar4] = local_a0[lVar4] + local_60.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_b0[2] = 0.0;
  lVar4 = 0;
  do {
    local_c0[lVar4 + 4] = local_c0[lVar4] + local_d0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_98 = 0x100000000;
  local_90 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a0[lVar4]] = local_c0[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}